

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::UpdateStats
               (BitpackingCompressionState<int,_true,_int> *state,idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  int iVar2;
  pointer pCVar3;
  int iVar4;
  int iVar5;
  
  this = &state->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    iVar4 = (state->state).maximum;
    iVar5 = *(int *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    iVar2 = *(int *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (iVar4 <= iVar5) {
      iVar5 = iVar4;
    }
    *(int *)((long)&(pCVar3->stats).statistics.stats_union + 8) = iVar5;
    if (iVar4 < iVar2) {
      iVar4 = iVar2;
    }
    *(int *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = iVar4;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    iVar4 = (state->state).minimum;
    iVar5 = *(int *)((long)&(pCVar3->stats).statistics.stats_union + 8);
    iVar2 = *(int *)((long)&(pCVar3->stats).statistics.stats_union + 0x18);
    if (iVar4 <= iVar5) {
      iVar5 = iVar4;
    }
    *(int *)((long)&(pCVar3->stats).statistics.stats_union + 8) = iVar5;
    if (iVar4 < iVar2) {
      iVar4 = iVar2;
    }
    *(int *)((long)&(pCVar3->stats).statistics.stats_union + 0x18) = iVar4;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}